

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void enumerate_bbs(gen_ctx_t gen_ctx)

{
  VARR_void_ptr_t **ppVVar1;
  gen_ctx_t pgVar2;
  size_t pre;
  size_t rpost;
  size_t local_10;
  size_t local_8;
  
  pgVar2 = gen_ctx;
  if (gen_ctx != (gen_ctx_t)0x0) {
    do {
      *(undefined8 *)&pgVar2->optimize_level = 0;
      pgVar2->curr_func_item = (MIR_item_t)0x0;
      ppVVar1 = &pgVar2->to_free;
      pgVar2 = (gen_ctx_t)*ppVVar1;
    } while ((gen_ctx_t)*ppVVar1 != (gen_ctx_t)0x0);
    if (gen_ctx != (gen_ctx_t)0x0) {
      local_8 = 0;
      pgVar2 = gen_ctx;
      do {
        pgVar2 = (gen_ctx_t)pgVar2->to_free;
        local_8 = local_8 + 1;
      } while (pgVar2 != (gen_ctx_t)0x0);
      goto LAB_0015f509;
    }
  }
  local_8 = 0;
LAB_0015f509:
  local_10 = 1;
  DFS((bb_t_conflict)gen_ctx,&local_10,&local_8);
  return;
}

Assistant:

static void enumerate_bbs (gen_ctx_t gen_ctx) {
  size_t pre, rpost;

  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    bb->pre = bb->rpost = 0;
  pre = 1;
  rpost = DLIST_LENGTH (bb_t, curr_cfg->bbs);
  DFS (DLIST_HEAD (bb_t, curr_cfg->bbs), &pre, &rpost);
}